

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O1

bool __thiscall
cbtConvexHullInternal::mergeProjection
          (cbtConvexHullInternal *this,IntermediateHull *h0,IntermediateHull *h1,Vertex **c0,
          Vertex **c1)

{
  Vertex *pVVar1;
  int32_t x;
  int iVar2;
  Vertex *pVVar3;
  Vertex *pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  Vertex *pVVar12;
  Vertex *pVVar13;
  int iVar14;
  int iVar15;
  Vertex *pVVar16;
  Vertex *pVVar17;
  bool bVar18;
  Vertex *local_78;
  
  pVVar12 = h0->maxYx;
  pVVar1 = h1->minYx;
  if (((pVVar12->point).x == (pVVar1->point).x) && ((pVVar12->point).y == (pVVar1->point).y)) {
    pVVar4 = pVVar1->prev;
    if (pVVar4 == pVVar1) {
      *c0 = pVVar12;
      pVVar12 = pVVar1;
      if (pVVar1->edges != (Edge *)0x0) {
        pVVar12 = pVVar1->edges->target;
      }
      *c1 = pVVar12;
    }
    else {
      pVVar12 = pVVar1->next;
      pVVar4->next = pVVar12;
      pVVar12->prev = pVVar4;
      if (pVVar1 == h1->minXy) {
        iVar15 = (pVVar4->point).x;
        iVar7 = (pVVar12->point).x;
        pVVar13 = pVVar12;
        if ((iVar15 <= iVar7) && ((iVar7 != iVar15 || ((pVVar4->point).y <= (pVVar12->point).y)))) {
          pVVar13 = pVVar4;
        }
        h1->minXy = pVVar13;
      }
      if (pVVar1 == h1->maxXy) {
        iVar15 = (pVVar4->point).x;
        iVar7 = (pVVar12->point).x;
        if ((iVar15 < iVar7) || ((iVar7 == iVar15 && ((pVVar4->point).y < (pVVar12->point).y)))) {
          h1->maxXy = pVVar12;
        }
        else {
          h1->maxXy = pVVar4;
        }
      }
    }
    if (pVVar4 == pVVar1) {
      return false;
    }
  }
  pVVar12 = h0->maxXy;
  pVVar1 = h1->maxXy;
  local_78 = (Vertex *)0x0;
  iVar7 = 1;
  pVVar13 = (Vertex *)0x0;
  pVVar4 = pVVar12;
  pVVar17 = pVVar1;
  iVar15 = 0;
  do {
    iVar6 = (pVVar4->point).x;
    iVar14 = ((pVVar17->point).x - iVar6) * iVar7;
    pVVar3 = pVVar4;
    pVVar16 = pVVar17;
    if (iVar14 < 1) {
      if (iVar14 < 0) {
        do {
          iVar6 = (pVVar16->point).y;
          iVar9 = (pVVar3->point).y;
          iVar2 = iVar6 - iVar9;
          pVVar4 = (&pVVar16->next)[iVar15 != 0];
          if (pVVar4 == pVVar16) {
LAB_009173c1:
            pVVar4 = (&pVVar3->next)[iVar15 != 0];
            iVar8 = 8;
            if (pVVar4 != pVVar3) {
              iVar6 = (pVVar4->point).x;
              iVar5 = ((pVVar16->point).x - iVar6) * iVar7;
              if ((iVar5 < 0) && (iVar9 = (pVVar4->point).y - iVar9, 0 < iVar9)) {
                iVar6 = (iVar6 - (pVVar3->point).x) * iVar7;
                if ((iVar6 == 0) || ((iVar6 < 0 && (iVar9 * iVar14 < iVar6 * iVar2)))) {
                  iVar8 = 7;
                  pVVar3 = pVVar4;
                  iVar14 = iVar5;
                }
              }
            }
          }
          else {
            iVar8 = 0;
            iVar6 = (pVVar4->point).y - iVar6;
            bVar18 = true;
            if (-1 < iVar6) {
              iVar5 = (pVVar4->point).x;
              iVar10 = (iVar5 - (pVVar16->point).x) * iVar7;
              if ((iVar10 == 0) || ((iVar10 < 0 && (iVar6 * iVar14 <= iVar10 * iVar2)))) {
                iVar14 = (iVar5 - (pVVar3->point).x) * iVar7;
                iVar8 = 7;
                bVar18 = false;
                pVVar16 = pVVar4;
              }
            }
            if (bVar18) goto LAB_009173c1;
          }
        } while (iVar8 == 7);
      }
      else {
        pVVar16 = pVVar4;
        iVar11 = (pVVar4->point).y;
        do {
          pVVar3 = pVVar16;
          pVVar16 = (&pVVar3->next)[iVar15 == 0];
          if ((pVVar16 == pVVar4) || ((pVVar16->point).x != iVar6)) break;
          iVar14 = (pVVar16->point).y;
          bVar18 = iVar14 <= iVar11;
          iVar11 = iVar14;
        } while (bVar18);
        pVVar4 = pVVar17;
        iVar11 = (pVVar17->point).y;
        do {
          pVVar16 = pVVar4;
          pVVar4 = (&pVVar16->next)[iVar15 != 0];
          if ((pVVar4 == pVVar17) || ((pVVar4->point).x != iVar6)) break;
          iVar14 = (pVVar4->point).y;
          bVar18 = iVar11 <= iVar14;
          iVar11 = iVar14;
        } while (bVar18);
      }
    }
    else {
      do {
        iVar6 = (pVVar16->point).y;
        iVar9 = (pVVar3->point).y;
        iVar2 = iVar6 - iVar9;
        pVVar4 = (&pVVar3->next)[iVar15 == 0];
        if (pVVar4 == pVVar3) {
LAB_0091728c:
          pVVar4 = (&pVVar16->next)[iVar15 == 0];
          iVar10 = 6;
          if (pVVar4 != pVVar16) {
            iVar9 = (pVVar4->point).x;
            iVar8 = (iVar9 - (pVVar3->point).x) * iVar7;
            if ((0 < iVar8) && (iVar6 = (pVVar4->point).y - iVar6, iVar6 < 0)) {
              iVar9 = (iVar9 - (pVVar16->point).x) * iVar7;
              if ((iVar9 == 0) || ((iVar9 < 0 && (iVar6 * iVar14 < iVar9 * iVar2)))) {
                iVar10 = 5;
                pVVar16 = pVVar4;
                iVar14 = iVar8;
              }
            }
          }
        }
        else {
          iVar8 = (pVVar4->point).y;
          iVar10 = 0;
          iVar5 = iVar8 - iVar9;
          bVar18 = true;
          if (iVar5 == 0 || iVar8 < iVar9) {
            iVar9 = (pVVar4->point).x;
            iVar8 = (iVar9 - (pVVar3->point).x) * iVar7;
            if ((iVar8 == 0) || ((iVar8 < 0 && (iVar5 * iVar14 <= iVar8 * iVar2)))) {
              iVar14 = ((pVVar16->point).x - iVar9) * iVar7;
              iVar10 = 5;
              bVar18 = false;
              pVVar3 = pVVar4;
            }
          }
          if (bVar18) goto LAB_0091728c;
        }
      } while (iVar10 == 5);
    }
    pVVar4 = pVVar3;
    pVVar17 = pVVar16;
    if (iVar15 == 0) {
      iVar7 = -1;
      pVVar4 = h0->minXy;
      pVVar13 = pVVar16;
      pVVar17 = h1->minXy;
      local_78 = pVVar3;
    }
    bVar18 = iVar15 != 0;
    iVar15 = iVar15 + 1;
    if (bVar18) {
      pVVar4->prev = pVVar17;
      pVVar17->next = pVVar4;
      local_78->next = pVVar13;
      pVVar13->prev = local_78;
      if ((h1->minXy->point).x < (h0->minXy->point).x) {
        h0->minXy = h1->minXy;
      }
      if ((pVVar12->point).x <= (pVVar1->point).x) {
        h0->maxXy = pVVar1;
      }
      h0->maxYx = h1->maxYx;
      *c0 = local_78;
      *c1 = pVVar13;
      return true;
    }
  } while( true );
}

Assistant:

bool cbtConvexHullInternal::mergeProjection(IntermediateHull& h0, IntermediateHull& h1, Vertex*& c0, Vertex*& c1)
{
	Vertex* v0 = h0.maxYx;
	Vertex* v1 = h1.minYx;
	if ((v0->point.x == v1->point.x) && (v0->point.y == v1->point.y))
	{
		cbtAssert(v0->point.z < v1->point.z);
		Vertex* v1p = v1->prev;
		if (v1p == v1)
		{
			c0 = v0;
			if (v1->edges)
			{
				cbtAssert(v1->edges->next == v1->edges);
				v1 = v1->edges->target;
				cbtAssert(v1->edges->next == v1->edges);
			}
			c1 = v1;
			return false;
		}
		Vertex* v1n = v1->next;
		v1p->next = v1n;
		v1n->prev = v1p;
		if (v1 == h1.minXy)
		{
			if ((v1n->point.x < v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y < v1p->point.y)))
			{
				h1.minXy = v1n;
			}
			else
			{
				h1.minXy = v1p;
			}
		}
		if (v1 == h1.maxXy)
		{
			if ((v1n->point.x > v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y > v1p->point.y)))
			{
				h1.maxXy = v1n;
			}
			else
			{
				h1.maxXy = v1p;
			}
		}
	}

	v0 = h0.maxXy;
	v1 = h1.maxXy;
	Vertex* v00 = NULL;
	Vertex* v10 = NULL;
	int32_t sign = 1;

	for (int side = 0; side <= 1; side++)
	{
		int32_t dx = (v1->point.x - v0->point.x) * sign;
		if (dx > 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;

				Vertex* w0 = side ? v0->next : v0->prev;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					if ((dy0 <= 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx <= dy * dx0))))
					{
						v0 = w0;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}

				Vertex* w1 = side ? v1->next : v1->prev;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					int32_t dxn = (w1->point.x - v0->point.x) * sign;
					if ((dxn > 0) && (dy1 < 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx < dy * dx1))))
					{
						v1 = w1;
						dx = dxn;
						continue;
					}
				}

				break;
			}
		}
		else if (dx < 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;

				Vertex* w1 = side ? v1->prev : v1->next;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					if ((dy1 >= 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx <= dy * dx1))))
					{
						v1 = w1;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}

				Vertex* w0 = side ? v0->prev : v0->next;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					int32_t dxn = (v1->point.x - w0->point.x) * sign;
					if ((dxn < 0) && (dy0 > 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx < dy * dx0))))
					{
						v0 = w0;
						dx = dxn;
						continue;
					}
				}

				break;
			}
		}
		else
		{
			int32_t x = v0->point.x;
			int32_t y0 = v0->point.y;
			Vertex* w0 = v0;
			Vertex* t;
			while (((t = side ? w0->next : w0->prev) != v0) && (t->point.x == x) && (t->point.y <= y0))
			{
				w0 = t;
				y0 = t->point.y;
			}
			v0 = w0;

			int32_t y1 = v1->point.y;
			Vertex* w1 = v1;
			while (((t = side ? w1->prev : w1->next) != v1) && (t->point.x == x) && (t->point.y >= y1))
			{
				w1 = t;
				y1 = t->point.y;
			}
			v1 = w1;
		}

		if (side == 0)
		{
			v00 = v0;
			v10 = v1;

			v0 = h0.minXy;
			v1 = h1.minXy;
			sign = -1;
		}
	}

	v0->prev = v1;
	v1->next = v0;

	v00->next = v10;
	v10->prev = v00;

	if (h1.minXy->point.x < h0.minXy->point.x)
	{
		h0.minXy = h1.minXy;
	}
	if (h1.maxXy->point.x >= h0.maxXy->point.x)
	{
		h0.maxXy = h1.maxXy;
	}

	h0.maxYx = h1.maxYx;

	c0 = v00;
	c1 = v10;

	return true;
}